

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

int PalFromRGB(uint32 rgb)

{
  byte bVar1;
  
  if ((LastPal < 0) || (LastRGB != rgb)) {
    bVar1 = GPalette.WhiteIndex;
    if ((rgb != 0xffffffff) && (bVar1 = GPalette.BlackIndex, rgb != 0xff000000)) {
      bVar1 = FColorMatcher::Pick(&ColorMatcher,rgb >> 0x10 & 0xff,rgb >> 8 & 0xff,rgb & 0xff);
    }
    LastPal = (int)bVar1;
    LastRGB = rgb;
  }
  return LastPal;
}

Assistant:

static int PalFromRGB(uint32 rgb)
{
	if (LastPal >= 0 && LastRGB == rgb)
	{
		return LastPal;
	}
	// Quick check for black and white.
	if (rgb == MAKEARGB(255,0,0,0))
	{
		LastPal = GPalette.BlackIndex;
	}
	else if (rgb == MAKEARGB(255,255,255,255))
	{
		LastPal = GPalette.WhiteIndex;
	}
	else
	{
		LastPal = ColorMatcher.Pick(RPART(rgb), GPART(rgb), BPART(rgb));
	}
	LastRGB = rgb;
	return LastPal;
}